

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_ptrmap_delete(stb_ptrmap *e,_func_void_void_ptr *free_func)

{
  int local_1c;
  int i;
  _func_void_void_ptr *free_func_local;
  stb_ptrmap *e_local;
  
  if (free_func != (_func_void_void_ptr *)0x0) {
    for (local_1c = 0; local_1c < e->limit; local_1c = local_1c + 1) {
      if ((e->table[local_1c].k != (void *)0x2) && (e->table[local_1c].k != (void *)0x6)) {
        if (free_func == free) {
          free(e->table[local_1c].v);
        }
        else {
          (*free_func)(e->table[local_1c].v);
        }
      }
    }
  }
  stb_ptrmap_destroy(e);
  return;
}

Assistant:

void stb_ptrmap_delete(stb_ptrmap *e, void (*free_func)(void *))
{
   int i;
   if (free_func)
      for (i=0; i < e->limit; ++i)
         if (e->table[i].k != STB_EMPTY && e->table[i].k != STB_EDEL) {
            if (free_func == free)
               free(e->table[i].v); // allow STB_MALLOC_WRAPPER to operate
            else
               free_func(e->table[i].v);
         }
   stb_ptrmap_destroy(e);
}